

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::make_unique<(anonymous_namespace)::SwiftCompilerTool,llvm::StringRef&>
          (llvm *this,StringRef *args)

{
  SwiftCompilerTool *this_00;
  StringRef *args_local;
  
  this_00 = (SwiftCompilerTool *)operator_new(0x28);
  anon_unknown.dwarf_60e82::SwiftCompilerTool::SwiftCompilerTool(this_00,*args);
  std::
  unique_ptr<(anonymous_namespace)::SwiftCompilerTool,std::default_delete<(anonymous_namespace)::SwiftCompilerTool>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::SwiftCompilerTool>,void>
            ((unique_ptr<(anonymous_namespace)::SwiftCompilerTool,std::default_delete<(anonymous_namespace)::SwiftCompilerTool>>
              *)this,this_00);
  return (__uniq_ptr_data<(anonymous_namespace)::SwiftCompilerTool,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::SwiftCompilerTool,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}